

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O2

void * rw::gl3::createNativeRaster(void *object,int32 offset,int32 param_3)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = (long)offset;
  *(undefined4 *)((long)object + lVar2 + 0x10) = 0;
  *(undefined4 *)((long)object + lVar2 + 0x20) = 0;
  puVar1 = (undefined8 *)((long)object + lVar2 + 0x28);
  *puVar1 = 0;
  puVar1[1] = 0;
  return object;
}

Assistant:

static void*
createNativeRaster(void *object, int32 offset, int32)
{
	Gl3Raster *ras = PLUGINOFFSET(Gl3Raster, object, offset);
	ras->texid = 0;
	ras->fbo = 0;
	ras->fboMate = nil;
	ras->backingStore = nil;
	return object;
}